

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaPSVIIDCBindingPtr_conflict
xmlSchemaIDCAcquireBinding(xmlSchemaValidCtxtPtr vctxt,xmlSchemaIDCMatcherPtr_conflict matcher)

{
  xmlSchemaNodeInfoPtr pxVar1;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar2;
  xmlSchemaPSVIIDCBindingPtr_conflict local_30;
  xmlSchemaPSVIIDCBindingPtr_conflict bind;
  xmlSchemaNodeInfoPtr ielem;
  xmlSchemaIDCMatcherPtr_conflict matcher_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  pxVar1 = vctxt->elemInfos[matcher->depth];
  if (pxVar1->idcTable == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
    pxVar2 = xmlSchemaIDCNewBinding(matcher->aidc->def);
    pxVar1->idcTable = pxVar2;
    if (pxVar1->idcTable == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
      vctxt_local = (xmlSchemaValidCtxtPtr)0x0;
    }
    else {
      vctxt_local = (xmlSchemaValidCtxtPtr)pxVar1->idcTable;
    }
  }
  else {
    local_30 = pxVar1->idcTable;
    do {
      if (local_30->definition == matcher->aidc->def) {
        return local_30;
      }
      if (local_30->next == (xmlSchemaPSVIIDCBindingPtr)0x0) {
        pxVar2 = xmlSchemaIDCNewBinding(matcher->aidc->def);
        local_30->next = pxVar2;
        if (local_30->next == (xmlSchemaPSVIIDCBindingPtr)0x0) {
          return (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
        }
        return local_30->next;
      }
      local_30 = local_30->next;
    } while (local_30 != (xmlSchemaPSVIIDCBindingPtr)0x0);
    vctxt_local = (xmlSchemaValidCtxtPtr)0x0;
  }
  return (xmlSchemaPSVIIDCBindingPtr_conflict)vctxt_local;
}

Assistant:

static xmlSchemaPSVIIDCBindingPtr
xmlSchemaIDCAcquireBinding(xmlSchemaValidCtxtPtr vctxt,
			  xmlSchemaIDCMatcherPtr matcher)
{
    xmlSchemaNodeInfoPtr ielem;

    ielem = vctxt->elemInfos[matcher->depth];

    if (ielem->idcTable == NULL) {
	ielem->idcTable = xmlSchemaIDCNewBinding(matcher->aidc->def);
	if (ielem->idcTable == NULL)
	    return (NULL);
	return(ielem->idcTable);
    } else {
	xmlSchemaPSVIIDCBindingPtr bind = NULL;

	bind = ielem->idcTable;
	do {
	    if (bind->definition == matcher->aidc->def)
		return(bind);
	    if (bind->next == NULL) {
		bind->next = xmlSchemaIDCNewBinding(matcher->aidc->def);
		if (bind->next == NULL)
		    return (NULL);
		return(bind->next);
	    }
	    bind = bind->next;
	} while (bind != NULL);
    }
    return (NULL);
}